

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
IGNOREMockCallTest_testForPerformanceProfiling_Test::testBody
          (IGNOREMockCallTest_testForPerformanceProfiling_Test *this)

{
  MockSupport *pMVar1;
  SimpleString local_68;
  SimpleString local_58;
  int local_44;
  undefined1 local_40 [4];
  int i;
  SimpleString local_20;
  IGNOREMockCallTest_testForPerformanceProfiling_Test *local_10;
  IGNOREMockCallTest_testForPerformanceProfiling_Test *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"");
  pMVar1 = mock(&local_20,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)local_40,"SimpleFunction");
  (*pMVar1->_vptr_MockSupport[5])(pMVar1,2000,local_40);
  SimpleString::~SimpleString((SimpleString *)local_40);
  SimpleString::~SimpleString(&local_20);
  for (local_44 = 0; local_44 < 2000; local_44 = local_44 + 1) {
    SimpleString::SimpleString(&local_58,"");
    pMVar1 = mock(&local_58,(MockFailureReporter *)0x0);
    SimpleString::SimpleString(&local_68,"SimpleFunction");
    (*pMVar1->_vptr_MockSupport[6])(pMVar1,&local_68);
    SimpleString::~SimpleString(&local_68);
    SimpleString::~SimpleString(&local_58);
  }
  return;
}

Assistant:

IGNORE_TEST(MockCallTest, testForPerformanceProfiling)
{
    /* TO fix! */
    mock().expectNCalls(2000, "SimpleFunction");
    for (int i = 0; i < 2000; i++) {
        mock().actualCall("SimpleFunction");
    }
}